

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

SnapShot * TTD::SnapShot::Parse(int64 snapId,ThreadContext *threadContext)

{
  size_t **string;
  ThreadContextTTD *pTVar1;
  TTDOpenResourceStreamCallback p_Var2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  JsTTDStreamHandle handle;
  SnapShot *pSVar6;
  undefined1 local_158 [8];
  TextFormatReader snapreader;
  char asciiResourceName [64];
  
  string = &snapreader.m_keyNameLengthArray;
  sprintf_s((char *)string,0x40,"snap_%I64i.snp",snapId);
  pTVar1 = threadContext->TTDContext;
  p_Var2 = (pTVar1->TTDataIOInfo).pfOpenResourceStream;
  sVar3 = (pTVar1->TTDataIOInfo).ActiveTTUriLength;
  pcVar4 = (pTVar1->TTDataIOInfo).ActiveTTUri;
  sVar5 = strlen((char *)string);
  handle = (*p_Var2)(sVar3,pcVar4,sVar5,(char *)string,true,false);
  if (handle != (JsTTDStreamHandle)0x0) {
    TextFormatReader::TextFormatReader
              ((TextFormatReader *)local_158,handle,(pTVar1->TTDataIOInfo).pfReadBytesFromStream,
               (pTVar1->TTDataIOInfo).pfFlushAndCloseStream);
    pSVar6 = ParseSnapshotFromFile((FileReader *)local_158);
    TextFormatReader::~TextFormatReader((TextFormatReader *)local_158);
    return pSVar6;
  }
  TTDAbort_unrecoverable_error("Failed to open snapshot resource stream for reading.");
}

Assistant:

SnapShot* SnapShot::Parse(int64 snapId, ThreadContext* threadContext)
    {
        char asciiResourceName[64];
        sprintf_s(asciiResourceName, 64, "snap_%I64i.snp", snapId);

        TTDataIOInfo& iofp = threadContext->TTDContext->TTDataIOInfo;
        JsTTDStreamHandle snapHandle = iofp.pfOpenResourceStream(iofp.ActiveTTUriLength, iofp.ActiveTTUri, strlen(asciiResourceName), asciiResourceName, true, false);
        TTDAssert(snapHandle != nullptr, "Failed to open snapshot resource stream for reading.");

        TTD_SNAP_READER snapreader(snapHandle, iofp.pfReadBytesFromStream, iofp.pfFlushAndCloseStream);
        SnapShot* snap = SnapShot::ParseSnapshotFromFile(&snapreader);

        return snap;
    }